

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void __thiscall
ON_MappingTag::ON_MappingTag(ON_MappingTag *this,ON_TextureMapping *mapping,ON_Xform *xform)

{
  bool bVar1;
  long lVar2;
  double *pdVar3;
  ON_Xform *pOVar4;
  byte bVar5;
  
  bVar5 = 0;
  (this->m_mapping_id).Data1 = 0;
  (this->m_mapping_id).Data2 = 0;
  (this->m_mapping_id).Data3 = 0;
  (this->m_mapping_id).Data4[0] = '\0';
  (this->m_mapping_id).Data4[1] = '\0';
  (this->m_mapping_id).Data4[2] = '\0';
  (this->m_mapping_id).Data4[3] = '\0';
  (this->m_mapping_id).Data4[4] = '\0';
  (this->m_mapping_id).Data4[5] = '\0';
  (this->m_mapping_id).Data4[6] = '\0';
  (this->m_mapping_id).Data4[7] = '\0';
  this->m_mapping_type = no_mapping;
  this->m_mapping_crc = 0;
  pdVar3 = (double *)&ON_Xform::IdentityTransformation;
  pOVar4 = &this->m_mesh_xform;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    pOVar4->m_xform[0][0] = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pOVar4 = (ON_Xform *)(pOVar4->m_xform[0] + 1);
  }
  memset(this,0,0x98);
  (this->m_mesh_xform).m_xform[0][0] = 1.0;
  (this->m_mesh_xform).m_xform[1][1] = 1.0;
  (this->m_mesh_xform).m_xform[2][2] = 1.0;
  (this->m_mesh_xform).m_xform[3][3] = 1.0;
  Set(this,mapping);
  bVar1 = TransformTreatedIsIdentity(xform);
  if (!bVar1) {
    pOVar4 = &this->m_mesh_xform;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      pOVar4->m_xform[0][0] = xform->m_xform[0][0];
      xform = (ON_Xform *)((long)xform + ((ulong)bVar5 * -2 + 1) * 8);
      pOVar4 = (ON_Xform *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
    }
  }
  return;
}

Assistant:

ON_MappingTag::ON_MappingTag(const ON_TextureMapping & mapping, const ON_Xform * xform)
{
  Default();
  Set(mapping);
  if ( false == ON_MappingTag::TransformTreatedIsIdentity(xform))
    m_mesh_xform = *xform;
}